

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void deqp::gles2::Functional::createQuadsTex2D
               (Context *context,deUint32 name,GLenum format,GLenum dataType,int width,int height)

{
  void *pvVar1;
  PixelBufferAccess local_b8;
  PixelBufferAccess local_80;
  undefined1 local_58 [8];
  TextureLevel level;
  TextureFormat texFormat;
  int height_local;
  int width_local;
  GLenum dataType_local;
  GLenum format_local;
  deUint32 name_local;
  Context *context_local;
  
  register0x00000000 = glu::mapGLTransferFormat(format,dataType);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_58,(TextureFormat *)((long)&level.m_data.m_cap + 4),width,height,
             1);
  tcu::TextureLevel::getAccess(&local_80,(TextureLevel *)local_58);
  tcu::fillWithRGBAQuads(&local_80);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)name);
  tcu::TextureLevel::getAccess(&local_b8,(TextureLevel *)local_58);
  pvVar1 = tcu::PixelBufferAccess::getDataPtr(&local_b8);
  (*context->_vptr_Context[0x11])
            (context,0xde1,0,(ulong)format,(ulong)(uint)width,(ulong)(uint)height,0,format,dataType,
             pvVar1);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_58);
  return;
}

Assistant:

static void createQuadsTex2D (sglr::Context& context, deUint32 name, GLenum format, GLenum dataType, int width, int height)
{
	tcu::TextureFormat	texFormat	= glu::mapGLTransferFormat(format, dataType);
	tcu::TextureLevel	level		(texFormat, width, height);

	tcu::fillWithRGBAQuads(level.getAccess());

	context.bindTexture(GL_TEXTURE_2D, name);
	context.texImage2D(GL_TEXTURE_2D, 0, format, width, height, 0, format, dataType, level.getAccess().getDataPtr());
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
}